

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setY(QGraphicsItem *this,qreal y)

{
  QGraphicsItemPrivate *pQVar1;
  ulong uVar2;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QPointF *in_XMM0_Qa;
  qreal xpos;
  QGraphicsItem *this_00;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI->d_ptr);
  if (((*(ulong *)&pQVar1->field_0x160 >> 0x37 & 1) == 0) &&
     (uVar2 = qIsNaN((double)in_XMM0_Qa), (uVar2 & 1) == 0)) {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDI->d_ptr);
    xpos = QPointF::x(&pQVar1->pos);
    QPointF::QPointF(&local_18,xpos,(qreal)in_XMM0_Qa);
    setPos(this_00,in_XMM0_Qa);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setY(qreal y)
{
    if (d_ptr->inDestructor)
        return;

    if (qIsNaN(y))
        return;

    setPos(QPointF(d_ptr->pos.x(), y));
}